

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DebugDrawCursorPos(ImU32 col)

{
  float fVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  ImVec2 local_30;
  ImVec2 local_28;
  
  pIVar3 = GImGui->CurrentWindow;
  fVar1 = (pIVar3->DC).CursorPos.x;
  fVar2 = (pIVar3->DC).CursorPos.y;
  local_28.y = fVar2 + -3.0;
  local_30.y = fVar2 + 4.0;
  local_30.x = fVar1;
  local_28.x = fVar1;
  ImDrawList::AddLine(pIVar3->DrawList,&local_28,&local_30,col,1.0);
  local_28.x = fVar1 + -3.0;
  local_30.x = fVar1 + 4.0;
  local_30.y = fVar2;
  local_28.y = fVar2;
  ImDrawList::AddLine(pIVar3->DrawList,&local_28,&local_30,col,1.0);
  return;
}

Assistant:

void ImGui::DebugDrawCursorPos(ImU32 col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImVec2 pos = window->DC.CursorPos;
    window->DrawList->AddLine(ImVec2(pos.x, pos.y - 3.0f), ImVec2(pos.x, pos.y + 4.0f), col, 1.0f);
    window->DrawList->AddLine(ImVec2(pos.x - 3.0f, pos.y), ImVec2(pos.x + 4.0f, pos.y), col, 1.0f);
}